

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile_tests.cpp
# Opt level: O0

void __thiscall skiwi::anon_unknown_23::vectors::vectors(vectors *this)

{
  vectors *this_local;
  
  compile_fixture::compile_fixture(&this->super_compile_fixture);
  (this->super_compile_fixture)._vptr_compile_fixture = (_func_int **)&PTR__vectors_0032d2b0;
  return;
}

Assistant:

void test()
      {
      TEST_EQ("#t", run("(vector? (make-vector 0)) "));
      TEST_EQ("12", run("(vector-length(make-vector 12)) "));
      TEST_EQ("#f", run("(vector? (cons 1 2)) "));
      TEST_EQ("#f", run("(vector? 1287) "));
      TEST_EQ("#f", run("(vector? ()) "));
      TEST_EQ("#f", run("(vector? #t) "));
      TEST_EQ("#f", run("(vector? #f) "));
      TEST_EQ("#f", run("(pair? (make-vector 12)) "));
      TEST_EQ("#f", run("(null? (make-vector 12)) "));
      TEST_EQ("#f", run("(boolean? (make-vector 12)) "));
      TEST_EQ("#()", run("(make-vector 0) "));
      TEST_EQ("#(3.14 3.14 3.14 3.14 3.14)", run("(make-vector 5 3.14) "));
      TEST_EQ("12", run("(vector-ref (make-vector 5 12) 0)"));
      TEST_EQ("12", run("(vector-ref (make-vector 5 12) 1)"));
      TEST_EQ("12", run("(vector-ref (make-vector 5 12) 2)"));
      TEST_EQ("12", run("(vector-ref (make-vector 5 12) 3)"));
      TEST_EQ("12", run("(vector-ref (make-vector 5 12) 4)"));

      TEST_EQ("#(5 3.14 (3 . 2))", run("(vector 5 3.14 (cons 3 2)) "));

      TEST_EQ("#(#t #f)", run("(let([v(make-vector 2)]) (vector-set! v 0 #t)(vector-set! v 1 #f) v) "));

      TEST_EQ("(#(100 200) . #(300 400))", run("(let([v0(make-vector 2)])(let([v1(make-vector 2)]) (vector-set! v0 0 100) (vector-set! v0 1 200)  (vector-set! v1 0 300)  (vector-set! v1 1 400) (cons v0 v1))) "));
      TEST_EQ("(#(100 200 150) . #(300 400 350))", run("(let([v0(make-vector 3)]) (let([v1(make-vector 3)]) (vector-set! v0 0 100)  (vector-set! v0 1 200)  (vector-set! v0 2 150) (vector-set! v1 0 300)  (vector-set! v1 1 400)  (vector-set! v1 2 350)  (cons v0 v1))) "));
      TEST_EQ("(#(100 200) . #(300 400))", run("(let([n 2])  (let([v0(make-vector n)]) (let([v1(make-vector n)])  (vector-set! v0 0 100) (vector-set! v0 1 200)  (vector-set! v1 0 300) (vector-set! v1 1 400)  (cons v0 v1)))) "));
      TEST_EQ("(#(100 200 150) . #(300 400 350))", run("(let([n 3]) (let([v0(make-vector n)]) (let([v1(make-vector(vector-length v0))]) (vector-set! v0(- (vector-length v0) 3) 100) (vector-set! v0(- (vector-length v1) 2) 200) (vector-set! v0(- (vector-length v0) 1) 150) (vector-set! v1(- (vector-length v1) 3) 300)  (vector-set! v1(- (vector-length v0) 2) 400)  (vector-set! v1(- (vector-length v1) 1) 350)  (cons v0 v1)))) "));
      TEST_EQ("1", run("(let([n 1]) (vector-set! (make-vector n) (sub1 n) (* n n)) n) "));
      TEST_EQ("1", run("(let([n 1])(let([v(make-vector 1)]) (vector-set! v(sub1 n) n) (vector-ref  v(sub1 n)))) "));
      TEST_EQ("(#(2) . #(13))", run("(let([v0(make-vector 1)]) (vector-set! v0 0 1) (let([v1(make-vector 1)]) (vector-set! v1 0 13)  (vector-set! (if (vector? v0) v0 v1) (sub1(vector-length(if (vector? v0) v0 v1)))  (add1(vector-ref  (if (vector? v0) v0 v1)  (sub1(vector-length(if (vector? v0) v0 v1))))))  (cons v0 v1))) "));
      TEST_EQ("100", run("(letrec([f (lambda(v i) (if (>= i 0) (begin (vector-set! v i i) (f v (sub1 i))) v))])(let([ v (make-vector 100) ]) (vector-length (f v (sub1 100)))))"));

      TEST_EQ("#t", run("(let([v(make-vector 2)]) (vector-set! v 0 v) (vector-set! v 1 v) (eq? (vector-ref  v 0) (vector-ref  v 1))) "));
      TEST_EQ("((1 . 2) . #t)", run("(let([v(make-vector 1)][y(cons 1 2)]) (vector-set! v 0 y) (cons y(eq? y(vector-ref  v 0)))) "));
      TEST_EQ("(3 . 3)", run("(letrec([f (lambda(v i) (if (>= i 0) (f v (sub1 i)) v))])(let([ v (cons 3 3) ]) (f v 3)))"));

      TEST_EQ("#(#undefined #undefined #undefined #undefined #undefined #undefined #undefined #undefined #undefined #undefined)", run("(let ([a (make-vector 10)] [b (make-vector 10)] [c (make-vector 10)]) a)"));
      }